

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O1

CURLcode smb_disconnect(Curl_easy *data,connectdata *conn,_Bool dead)

{
  (*Curl_cfree)((conn->proto).smbc.share);
  (conn->proto).ftpc.pp.sendleft = 0;
  (*Curl_cfree)((conn->proto).smbc.domain);
  (conn->proto).ftpc.pp.sendthis = (char *)0x0;
  (*Curl_cfree)((conn->proto).smbc.recv_buf);
  *(undefined8 *)&(conn->proto).ftpc.pp.response.tv_usec = 0;
  return CURLE_OK;
}

Assistant:

static CURLcode smb_disconnect(struct Curl_easy *data,
                               struct connectdata *conn, bool dead)
{
  struct smb_conn *smbc = &conn->proto.smbc;
  (void) dead;
  (void) data;
  Curl_safefree(smbc->share);
  Curl_safefree(smbc->domain);
  Curl_safefree(smbc->recv_buf);
  return CURLE_OK;
}